

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O0

void __thiscall miniros::master::Master::setResolveNodeIP(Master *this,bool resolv)

{
  byte in_SIL;
  RpcValue *in_stack_00000320;
  string *in_stack_00000328;
  string *in_stack_00000330;
  ParameterStorage *in_stack_00000338;
  bool in_stack_ffffffffffffff4f;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  allocator<char> *in_stack_ffffffffffffff80;
  anon_union_8_8_d5adaace_for__value in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  MasterHandler::setResolveNodeIP
            ((MasterHandler *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4f);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88.asTime,
             in_stack_ffffffffffffff80);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88.asTime,
             in_stack_ffffffffffffff80);
  XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&stack0xffffffffffffff80,(bool)(local_9 & 1));
  ParameterStorage::setParam
            (in_stack_00000338,in_stack_00000330,in_stack_00000328,in_stack_00000320);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x52d19e);
  ::std::__cxx11::string::~string(local_68);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  ::std::__cxx11::string::~string(local_30);
  ::std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void Master::setResolveNodeIP(bool resolv)
{
  m_handler.setResolveNodeIP(resolv);
  m_parameterStorage.setParam("master", "/resolve_ip", resolv);
}